

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_stctg(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  TCGTemp *local_30;
  
  if (((s->fields).presentO & 1) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    pTVar1 = tcg_const_i32_s390x(tcg_ctx,(s->fields).c[0]);
    if (((s->fields).presentO & 4) != 0) {
      pTVar2 = tcg_const_i32_s390x(tcg_ctx,(s->fields).c[2]);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_38 = o->in2 + (long)tcg_ctx;
      local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
      local_30 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_stctg,(TCGTemp *)0x0,4,&local_48);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return DISAS_NEXT;
    }
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static int get_field1(const DisasContext *s, enum DisasFieldIndexO o,
                      enum DisasFieldIndexC c)
{
    assert(have_field1(s, o));
    return s->fields.c[c];
}